

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

vector<soul::Type,_std::allocator<soul::Type>_> * __thiscall
soul::heart::Parser::readEventTypeList
          (vector<soul::Type,_std::allocator<soul::Type>_> *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  Type local_78;
  char *local_60;
  char *local_58;
  Type local_50;
  char *local_28;
  undefined1 local_19;
  Parser *local_18;
  Parser *this_local;
  vector<soul::Type,_std::allocator<soul::Type>_> *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  std::vector<soul::Type,_std::allocator<soul::Type>_>::vector(__return_storage_ptr__);
  local_28 = "(";
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x573c42);
  if (bVar1) {
    do {
      readValueType(&local_50,this);
      std::vector<soul::Type,_std::allocator<soul::Type>_>::push_back
                (__return_storage_ptr__,&local_50);
      Type::~Type(&local_50);
      local_58 = ",";
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)",");
    } while (bVar1);
    local_60 = ")";
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x571824);
  }
  else {
    readValueType(&local_78,this);
    std::vector<soul::Type,_std::allocator<soul::Type>_>::push_back
              (__return_storage_ptr__,&local_78);
    Type::~Type(&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Type> readEventTypeList()
    {
        std::vector<Type> result;

        if (matchIf (HEARTOperator::openParen))
        {
            for (;;)
            {
                result.push_back (readValueType());

                if (! matchIf (HEARTOperator::comma))
                    break;
            }

            expect (HEARTOperator::closeParen);
        }
        else
        {
            result.push_back (readValueType());
        }

        return result;
    }